

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O3

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  int extraout_EAX;
  uv_barrier_t *barrier_00;
  long lVar2;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_thread_t threads [4];
  uv_barrier_t barrier;
  uv_barrier_t local_68;
  uv_barrier_t local_40;
  
  iVar1 = uv_barrier_init(&local_40,5);
  local_68.__align = (long)iVar1;
  if (local_68.__align == 0) {
    lVar2 = 0;
    do {
      iVar1 = uv_thread_create((uv_thread_t *)(local_68.__size + lVar2),serial_worker,&local_40);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_0017efe9;
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    iVar1 = 5;
    do {
      uv_barrier_wait(&local_40);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = uv_barrier_wait(&local_40);
    if (0 < iVar1) {
      uv_barrier_destroy(&local_40);
    }
    lVar2 = 0;
    while( true ) {
      iVar1 = uv_thread_join((uv_thread_t *)(local_68.__size + lVar2));
      if (iVar1 != 0) break;
      lVar2 = lVar2 + 8;
      if (lVar2 == 0x20) {
        return 0;
      }
    }
LAB_0017efe9:
    run_test_barrier_serial_thread_cold_3();
  }
  barrier_00 = &local_68;
  run_test_barrier_serial_thread_cold_1();
  iVar1 = 5;
  do {
    uv_barrier_wait(barrier_00);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = uv_barrier_wait(barrier_00);
  if (0 < iVar1) {
    uv_barrier_destroy(barrier_00);
  }
  uv_sleep(100);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT_OK(uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_create(&threads[i], serial_worker, &barrier));

  for (i = 0; i < 5; i++)
    uv_barrier_wait(&barrier);
  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_join(&threads[i]));

  return 0;
}